

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O2

void __thiscall QEvdevTabletData::processInputEvent(QEvdevTabletData *this,input_event *ev)

{
  __u16 _Var1;
  uint uVar2;
  int iVar3;
  
  uVar2 = (uint)ev->type;
  if (ev->type == 0) {
    uVar2 = 0;
    if ((ev->code == 0) && (this->lastEventType != 0)) {
      report(this);
      uVar2 = (uint)ev->type;
    }
  }
  else if (uVar2 == 1) {
    _Var1 = ev->code;
    uVar2 = 1;
    if (_Var1 == 0x140) {
      iVar3 = (uint)(ev->value != 0) << 2;
    }
    else {
      if (_Var1 != 0x141) {
        if (_Var1 == 0x14a) {
          (this->state).down = ev->value != 0;
        }
        goto LAB_00107ef1;
      }
      iVar3 = (uint)(ev->value != 0) << 3;
    }
    (this->state).tool = iVar3;
  }
  else if (uVar2 == 3) {
    _Var1 = ev->code;
    uVar2 = 3;
    if (_Var1 == 0x19) {
      (this->state).d = ev->value;
    }
    else if (_Var1 == 1) {
      (this->state).y = ev->value;
    }
    else if (_Var1 == 0x18) {
      (this->state).p = ev->value;
    }
    else if (_Var1 == 0) {
      (this->state).x = ev->value;
    }
  }
LAB_00107ef1:
  this->lastEventType = uVar2;
  return;
}

Assistant:

void QEvdevTabletData::processInputEvent(input_event *ev)
{
    if (ev->type == EV_ABS) {
        switch (ev->code) {
        case ABS_X:
            state.x = ev->value;
            break;
        case ABS_Y:
            state.y = ev->value;
            break;
        case ABS_PRESSURE:
            state.p = ev->value;
            break;
        case ABS_DISTANCE:
            state.d = ev->value;
            break;
        default:
            break;
        }
    } else if (ev->type == EV_KEY) {
        // code BTN_TOOL_* value 1 -> proximity enter
        // code BTN_TOOL_* value 0 -> proximity leave
        // code BTN_TOUCH value 1 -> contact with screen
        // code BTN_TOUCH value 0 -> no contact
        switch (ev->code) {
        case BTN_TOUCH:
            state.down = ev->value != 0;
            break;
        case BTN_TOOL_PEN:
            state.tool = ev->value ? int(QPointingDevice::PointerType::Pen) : 0;
            break;
        case BTN_TOOL_RUBBER:
            state.tool = ev->value ? int(QPointingDevice::PointerType::Eraser) : 0;
            break;
        default:
            break;
        }
    } else if (ev->type == EV_SYN && ev->code == SYN_REPORT && lastEventType != ev->type) {
        report();
    }
    lastEventType = ev->type;
}